

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

void __thiscall icu_63::UnicodeString::swap(UnicodeString *this,UnicodeString *other)

{
  undefined1 local_58 [8];
  UnicodeString temp;
  UnicodeString *other_local;
  UnicodeString *this_local;
  
  temp.fUnion._48_8_ = other;
  UnicodeString((UnicodeString *)local_58);
  copyFieldsFrom((UnicodeString *)local_58,this,'\0');
  copyFieldsFrom(this,(UnicodeString *)temp.fUnion._48_8_,'\0');
  copyFieldsFrom((UnicodeString *)temp.fUnion._48_8_,(UnicodeString *)local_58,'\0');
  temp.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 2;
  ~UnicodeString((UnicodeString *)local_58);
  return;
}

Assistant:

void UnicodeString::swap(UnicodeString &other) U_NOEXCEPT {
  UnicodeString temp;  // Empty short string: Known not to need releaseArray().
  // Copy fields without resetting source values in between.
  temp.copyFieldsFrom(*this, FALSE);
  this->copyFieldsFrom(other, FALSE);
  other.copyFieldsFrom(temp, FALSE);
  // Set temp to an empty string so that other's memory is not released twice.
  temp.fUnion.fFields.fLengthAndFlags = kShortString;
}